

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang.cc
# Opt level: O0

Node __thiscall verona::call_lhs(verona *this,Node *call)

{
  bool bVar1;
  Node *node;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Node NVar2;
  Token local_c0;
  WFLookup local_b8;
  TokenDef local_98;
  Token local_88;
  WFLookup local_80;
  Token local_60 [3];
  Token local_48;
  undefined1 local_40 [8];
  WFLookup f;
  Node *call_local;
  
  trieste::Token::Token((Token *)&f.index,(TokenDef *)Call);
  bVar1 = trieste::operator==(call,(Token *)&f.index);
  if (bVar1) {
    trieste::Token::Token(&local_48,(TokenDef *)Selector);
    trieste::operator/((WFLookup *)local_40,call,&local_48);
    node = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_((WFLookup *)local_40);
    trieste::Token::Token(local_60,(TokenDef *)FQFunction);
    bVar1 = trieste::operator==(node,local_60);
    if (bVar1) {
      trieste::Token::Token(&local_88,(TokenDef *)Selector);
      trieste::wf::detail::WFLookup::operator/(&local_80,(WFLookup *)local_40,&local_88);
      trieste::wf::detail::WFLookup::operator=((WFLookup *)local_40,&local_80);
      trieste::wf::detail::WFLookup::~WFLookup(&local_80);
    }
    trieste::TokenDef::operator_cast_to_shared_ptr(&local_98);
    trieste::Token::Token(&local_c0,(TokenDef *)Ref);
    trieste::wf::detail::WFLookup::operator/(&local_b8,(WFLookup *)local_40,&local_c0);
    trieste::wf::detail::WFLookup::operator=(&local_b8,(Node *)&local_98);
    trieste::wf::detail::WFLookup::~WFLookup(&local_b8);
    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)&local_98);
    ::std::shared_ptr<trieste::NodeDef>::shared_ptr((shared_ptr<trieste::NodeDef> *)this,call);
    trieste::wf::detail::WFLookup::~WFLookup((WFLookup *)local_40);
    NVar2.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    NVar2.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Node)NVar2.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("call == Call",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lang.cc",
                0xd0,"Node verona::call_lhs(Node)");
}

Assistant:

Node call_lhs(Node call)
  {
    assert(call == Call);
    auto f = call / Selector;

    if (f == FQFunction)
      f = f / Selector;

    (f / Ref) = Lhs;
    return call;
  }